

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
FactoredDecPOMDPDiscrete::SetRewardForLRF
          (FactoredDecPOMDPDiscrete *this,Index LRF,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,Scope *Y,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys,Scope *O,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Os,double reward)

{
  pointer pSVar1;
  pointer pSVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  uVar3 = (ulong)LRF;
  dVar5 = (double)(**(code **)(*(long *)&(this->
                                         super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                         super_MultiAgentDecisionProcess + 0x270))();
  pSVar1 = (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
  if (uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
    pSVar2 = (this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x5555555555555555;
    if (uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
      dVar6 = TwoStageDynamicBayesianNetwork::GetYOProbability
                        (&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn,
                         pSVar1 + uVar3,Xs,pSVar2 + uVar3,As,Y,Ys,O,Os);
      SetRewardForLRF(this,LRF,Xs,As,dVar6 * reward + dVar5);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void FactoredDecPOMDPDiscrete::SetRewardForLRF(Index LRF,
            const vector<Index>& Xs,
            const vector<Index>& As,
            const Scope& Y,
            const vector<Index>& Ys,
            const Scope& O,
            const vector<Index>& Os,
            double reward
        )
{
#if DEBUG_SETR 
    string indent = "\t";
    cerr<<indent;
    cerr<< "SetRewardForLRF with Y and O scopes called: LRF="<<LRF<<
        ", r="<<reward<<endl;
#endif
    double r_xa = GetLRFReward(LRF, Xs, As);
    double P_yo_xa = GetYOProbability( 
            _m_sfScopes.at(LRF), Xs,
            _m_agScopes.at(LRF), As,
            Y, Ys,
            O, Os);
    double r_weighted = P_yo_xa * reward;
    r_xa += r_weighted;
    SetRewardForLRF(LRF, Xs, As, r_xa);
}